

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> *
Catch::ListeningReporter::getSupportedVerbosities(void)

{
  _Rb_tree_header *p_Var1;
  set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> *in_RDI;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl = 0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return in_RDI;
}

Assistant:

std::set<Verbosity> ListeningReporter::getSupportedVerbosities() {
        return std::set<Verbosity>{ };
    }